

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O2

istream * operator>>(istream *is,MTRand *mtrand)

{
  int iVar1;
  
  for (iVar1 = 0; iVar1 != 0x1380; iVar1 = iVar1 + 8) {
    std::istream::_M_extract<unsigned_long>((ulong *)is);
  }
  std::istream::operator>>((istream *)is,&mtrand->left);
  mtrand->pNext = (uint32 *)((long)mtrand + (0x270 - (long)mtrand->left) * 8);
  return is;
}

Assistant:

std::istream &operator>>(std::istream &is, MTRand &mtrand) {
  MTRand::uint32 *s = mtrand.state;
  int i = mtrand.N;
  for (; i--; is >> *s++) {
  }
  is >> mtrand.left;
  mtrand.pNext = &mtrand.state[mtrand.N - mtrand.left];
  return is;
}